

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Reader __thiscall capnp::_::OrphanBuilder::asDataReader(OrphanBuilder *this)

{
  SegmentBuilder *segment;
  bool bVar1;
  WirePointer *pWVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  Fault local_50;
  Fault f;
  undefined1 local_40 [8];
  DebugComparison<bool,_bool> _kjCondition;
  OrphanBuilder *this_local;
  
  _kjCondition._24_8_ = this;
  pWVar2 = tagAsPtr(this);
  f.exception._6_1_ = WirePointer::isNull(pWVar2);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  f.exception._5_1_ = this->location == (word *)0x0;
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_40,
             (DebugExpression<bool> *)((long)&f.exception + 7),(bool *)((long)&f.exception + 5));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<bool,bool>&>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xe5b,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","_kjCondition,",
               (DebugComparison<bool,_bool> *)local_40);
    kj::_::Debug::Fault::fatal(&local_50);
  }
  segment = this->segment;
  pWVar2 = tagAsPtr(this);
  AVar3 = (ArrayPtr<const_unsigned_char>)
          WireHelpers::readDataPointer
                    (&segment->super_SegmentReader,pWVar2,this->location,(void *)0x0,0);
  return (Reader)AVar3;
}

Assistant:

Data::Reader OrphanBuilder::asDataReader() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readDataPointer(segment, tagAsPtr(), location, nullptr, ZERO * BYTES);
}